

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdateSingle(Fxu_Matrix *p)

{
  Fxu_Var *pVar1_00;
  Fxu_Var *pVar2_00;
  long lVar1;
  int iVar2;
  Fxu_Var *pVar2;
  Fxu_Var *pVar1;
  Fxu_Var *pVarD;
  Fxu_Var *pVarC;
  Fxu_Cube *pCubeNew;
  Fxu_Cube *pCube;
  Fxu_Single *pSingle;
  Fxu_Matrix *p_local;
  
  pSingle = (Fxu_Single *)p;
  pCube = (Fxu_Cube *)Fxu_HeapSingleReadMax(p->pHeapSingle);
  pVar1_00 = pCube->pVar;
  pVar2_00 = (Fxu_Var *)(pCube->lLits).pHead;
  Fxu_UpdateCreateNewVars((Fxu_Matrix *)pSingle,&pVarD,&pVar1,1);
  pVarC = (Fxu_Var *)Fxu_MatrixAddCube((Fxu_Matrix *)pSingle,pVar1,0);
  pVarC->pFirst = (Fxu_Cube *)pVarC;
  pVar1->pFirst = (Fxu_Cube *)pVarC;
  *(Fxu_Single **)&pSingle[3].Weight = pSingle + 3;
  pSingle[3].Num = 0;
  pSingle[3].HNum = 0;
  pSingle[3].pVar2 = (Fxu_Var *)&pSingle[3].pVar1;
  pSingle[3].pVar1 = (Fxu_Var *)0x0;
  *(Fxu_Var **)pSingle[3].pVar2 = pVar1_00;
  pSingle[3].pVar2 = (Fxu_Var *)&pVar1_00->pOrder;
  pVar1_00->pOrder = (Fxu_Var *)0x1;
  *(Fxu_Var **)pSingle[3].pVar2 = pVar2_00;
  pSingle[3].pVar2 = (Fxu_Var *)&pVar2_00->pOrder;
  pVar2_00->pOrder = (Fxu_Var *)0x1;
  Fxu_UpdateMatrixSingleClean((Fxu_Matrix *)pSingle,pVar1_00,pVar2_00,pVar1);
  if (pVar2_00->iVar <= pVar1_00->iVar) {
    __assert_fail("pVar1->iVar < pVar2->iVar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                  ,0xb9,"void Fxu_UpdateSingle(Fxu_Matrix *)");
  }
  iVar2 = Fxu_SingleCountCoincidence((Fxu_Matrix *)pSingle,pVar1_00,pVar2_00);
  if (iVar2 != 0) {
    __assert_fail("Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                  ,0xba,"void Fxu_UpdateSingle(Fxu_Matrix *)");
  }
  Fxu_MatrixAddLiteral((Fxu_Matrix *)pSingle,(Fxu_Cube *)pVarC,pVar1_00);
  Fxu_MatrixAddLiteral((Fxu_Matrix *)pSingle,(Fxu_Cube *)pVarC,pVar2_00);
  lVar1._0_4_ = pSingle[3].Num;
  lVar1._4_4_ = pSingle[3].HNum;
  if (lVar1 != 0) {
    for (pCubeNew = *(Fxu_Cube **)(pSingle + 3); pCubeNew != (Fxu_Cube *)0x1;
        pCubeNew = pCubeNew->pOrder) {
      Fxu_UpdateAddNewDoubles((Fxu_Matrix *)pSingle,pCubeNew);
    }
  }
  Fxu_UpdateCleanOldSingles((Fxu_Matrix *)pSingle);
  Fxu_MatrixRingCubesUnmark((Fxu_Matrix *)pSingle);
  Fxu_MatrixRingVarsUnmark((Fxu_Matrix *)pSingle);
  Fxu_UpdateAddNewSingles((Fxu_Matrix *)pSingle,pVarD);
  Fxu_UpdateAddNewSingles((Fxu_Matrix *)pSingle,pVar1);
  *(int *)((long)&pSingle[3].pNext + 4) = *(int *)((long)&pSingle[3].pNext + 4) + 1;
  return;
}

Assistant:

void Fxu_UpdateSingle( Fxu_Matrix * p )
{
    Fxu_Single * pSingle;
	Fxu_Cube * pCube, * pCubeNew;
	Fxu_Var * pVarC, * pVarD;
	Fxu_Var * pVar1, * pVar2;

    // read the best divisor from the heap
    pSingle = Fxu_HeapSingleReadMax( p->pHeapSingle );
    // get the variables of this single-cube divisor
    pVar1 = pSingle->pVar1;
    pVar2 = pSingle->pVar2;

    // create two new columns (vars)
    Fxu_UpdateCreateNewVars( p, &pVarC, &pVarD, 1 );
    // create one new row (cube)
    pCubeNew = Fxu_MatrixAddCube( p, pVarD, 0 );
    pCubeNew->pFirst = pCubeNew;
    // set the first cube
    pVarD->pFirst = pCubeNew;

    // start collecting the affected vars and cubes
    Fxu_MatrixRingCubesStart( p );
    Fxu_MatrixRingVarsStart( p );
    // add the vars
    Fxu_MatrixRingVarsAdd( p, pVar1 );
    Fxu_MatrixRingVarsAdd( p, pVar2 );
    // remove the literals and collect the affected cubes
    // remove the divisors associated with this cube
   	// add to the affected cube the literal corresponding to the new column
	Fxu_UpdateMatrixSingleClean( p, pVar1, pVar2, pVarD );
    // stop collecting the affected vars and cubes
    Fxu_MatrixRingCubesStop( p );
    Fxu_MatrixRingVarsStop( p );

    // add the literals to the new cube
    assert( pVar1->iVar < pVar2->iVar );
    assert( Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar1 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar2 );

    // create new doubles; we cannot add them in the same loop
	// because we first have to create *all* new cubes for each node
    Fxu_MatrixForEachCubeInRing( p, pCube )
   		Fxu_UpdateAddNewDoubles( p, pCube );
    // update the singles after removing some literals
    Fxu_UpdateCleanOldSingles( p );
    // we should undo the rings before creating new singles

    // unmark the cubes
    Fxu_MatrixRingCubesUnmark( p );
    Fxu_MatrixRingVarsUnmark( p );

    // create new singles
    Fxu_UpdateAddNewSingles( p, pVarC );
    Fxu_UpdateAddNewSingles( p, pVarD );
	p->nDivs1++;
}